

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

QComboBoxPrivateContainer * __thiscall QComboBoxPrivate::viewContainer(QComboBoxPrivate *this)

{
  QPointer<QComboBoxPrivateContainer> *this_00;
  QComboBox *cmb;
  long *plVar1;
  bool bVar2;
  QComboBoxPrivateContainer *pQVar3;
  QComboBoxListView *this_01;
  QItemSelectionModel *signal;
  Data *pDVar4;
  QObject *signal_00;
  ConnectionType type;
  QObject *signal_01;
  long in_FS_OFFSET;
  undefined1 local_58 [16];
  code *local_48;
  undefined8 uStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->container;
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (bVar2) {
    pDVar4 = (this_00->wp).d;
    if (pDVar4 != (Data *)0x0) goto LAB_003aeeab;
  }
  else {
    cmb = *(QComboBox **)&(this->super_QWidgetPrivate).field_0x8;
    pQVar3 = (QComboBoxPrivateContainer *)operator_new(0x80);
    this_01 = (QComboBoxListView *)operator_new(0x30);
    QComboBoxListView::QComboBoxListView(this_01,cmb);
    QComboBoxPrivateContainer::QComboBoxPrivateContainer(pQVar3,(QAbstractItemView *)this_01,cmb);
    QWeakPointer<QObject>::assign<QObject>(&this_00->wp,(QObject *)pQVar3);
    disconnectModel(this);
    plVar1 = *(long **)((this->container).wp.value + 0x50);
    (**(code **)(*plVar1 + 0x1c8))(plVar1,this->model);
    connectModel(this);
    QAbstractItemView::setTextElideMode
              (*(QAbstractItemView **)((this->container).wp.value + 0x50),ElideMiddle);
    updateDelegate(this,true);
    updateLayoutDirection(this);
    updateViewContainerPaletteAndOpacity(this);
    pDVar4 = (this->container).wp.d;
    if ((pDVar4 == (Data *)0x0) || (*(int *)(pDVar4 + 4) == 0)) {
      signal_00 = (QObject *)0x0;
    }
    else {
      signal_00 = (this->container).wp.value;
    }
    local_48 = itemSelected;
    uStack_40 = 0;
    signal_01 = (QObject *)0x0;
    type = (ConnectionType)this;
    QObjectPrivate::
    connect<void(QComboBoxPrivateContainer::*)(QModelIndex_const&),void(QComboBoxPrivate::*)(QModelIndex_const&)>
              ((Object *)&stack0xffffffffffffffc8,
               (offset_in_QComboBoxPrivateContainer_to_subr)signal_00,
               (Object *)QComboBoxPrivateContainer::itemSelected,0,type);
    QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffc8);
    signal = QAbstractItemView::selectionModel
                       (*(QAbstractItemView **)((this->container).wp.value + 0x50));
    local_48 = emitHighlighted;
    uStack_40 = 0;
    QObjectPrivate::
    connect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QComboBoxPrivate::*)(QModelIndex_const&)>
              ((Object *)(local_58 + 8),(offset_in_QItemSelectionModel_to_subr)signal,
               (Object *)QItemSelectionModel::currentChanged,0,type);
    QMetaObject::Connection::~Connection((Connection *)(local_58 + 8));
    pDVar4 = (this->container).wp.d;
    if (pDVar4 != (Data *)0x0) {
      if (*(int *)(pDVar4 + 4) == 0) {
        signal_01 = (QObject *)0x0;
      }
      else {
        signal_01 = (this->container).wp.value;
      }
    }
    local_48 = resetButton;
    uStack_40 = 0;
    pQVar3 = (QComboBoxPrivateContainer *)0x0;
    QObjectPrivate::connect<void(QComboBoxPrivateContainer::*)(),void(QComboBoxPrivate::*)()>
              ((Object *)local_58,(offset_in_QComboBoxPrivateContainer_to_subr)signal_01,
               (Object *)QComboBoxPrivateContainer::resetButton,0,type);
    QMetaObject::Connection::~Connection((Connection *)local_58);
    pDVar4 = (this->container).wp.d;
    if (pDVar4 == (Data *)0x0) goto LAB_003aeebe;
LAB_003aeeab:
    if (*(int *)(pDVar4 + 4) != 0) {
      pQVar3 = (QComboBoxPrivateContainer *)(this->container).wp.value;
      goto LAB_003aeebe;
    }
  }
  pQVar3 = (QComboBoxPrivateContainer *)0x0;
LAB_003aeebe:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return pQVar3;
}

Assistant:

QComboBoxPrivateContainer* QComboBoxPrivate::viewContainer()
{
    if (container)
        return container;

    Q_Q(QComboBox);
    container = new QComboBoxPrivateContainer(new QComboBoxListView(q), q);
    disconnectModel();
    container->itemView()->setModel(model);
    connectModel();
    container->itemView()->setTextElideMode(Qt::ElideMiddle);
    updateDelegate(true);
    updateLayoutDirection();
    updateViewContainerPaletteAndOpacity();
    QObjectPrivate::connect(container, &QComboBoxPrivateContainer::itemSelected,
                            this, &QComboBoxPrivate::itemSelected);
    QObjectPrivate::connect(container->itemView()->selectionModel(),
                            &QItemSelectionModel::currentChanged,
                            this, &QComboBoxPrivate::emitHighlighted);
    QObjectPrivate::connect(container, &QComboBoxPrivateContainer::resetButton,
                            this, &QComboBoxPrivate::resetButton);
    return container;
}